

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemeditorfactory.cpp
# Opt level: O2

QWidget * __thiscall
QItemEditorFactory::createEditor(QItemEditorFactory *this,int userType,QWidget *parent)

{
  int iVar1;
  QItemEditorCreatorBase *pQVar2;
  undefined4 extraout_var;
  QItemEditorFactory *pQVar4;
  undefined4 extraout_var_00;
  long in_FS_OFFSET;
  QItemEditorCreatorBase *local_28;
  uint local_1c;
  long local_18;
  QWidget *pQVar3;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (QItemEditorCreatorBase *)0x0;
  local_1c = userType;
  pQVar2 = QHash<int,_QItemEditorCreatorBase_*>::value(&this->creatorMap,(int *)&local_1c,&local_28)
  ;
  if (pQVar2 == (QItemEditorCreatorBase *)0x0) {
    pQVar4 = defaultFactory();
    if (pQVar4 == this) {
      pQVar3 = (QWidget *)0x0;
    }
    else {
      iVar1 = (*pQVar4->_vptr_QItemEditorFactory[2])(pQVar4,(ulong)local_1c,parent);
      pQVar3 = (QWidget *)CONCAT44(extraout_var_00,iVar1);
    }
  }
  else {
    iVar1 = (*pQVar2->_vptr_QItemEditorCreatorBase[2])(pQVar2,parent);
    pQVar3 = (QWidget *)CONCAT44(extraout_var,iVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QWidget *QItemEditorFactory::createEditor(int userType, QWidget *parent) const
{
    QItemEditorCreatorBase *creator = creatorMap.value(userType, 0);
    if (!creator) {
        const QItemEditorFactory *dfactory = defaultFactory();
        return dfactory == this ? nullptr : dfactory->createEditor(userType, parent);
    }
    return creator->createWidget(parent);
}